

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O0

void WavParserHelper::PrintJunkChunk(JunkChunk rhs)

{
  undefined4 in_stack_0000000c;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string ckID;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,&stack0x00000008,&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::resize((ulong)local_28);
  std::operator+(&local_60,"ChunkID: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  PrintLog(&local_60,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::to_string(&local_a0,CONCAT864(rhs,in_stack_0000000c));
  std::operator+(&local_80,"ChunkSize: ",&local_a0);
  PrintLog(&local_80,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void WavParserHelper::PrintJunkChunk(JunkChunk rhs)
{
	std::string ckID(rhs.ckID);
	ckID.resize(4);

	PrintLog("ChunkID: " + ckID);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	std::cout << std::endl;
}